

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O2

void CreateGyroLogFile(void)

{
  tm *__tp;
  size_t sVar1;
  time_t timer;
  char str_data [64];
  
  timer = time((time_t *)0x0);
  __tp = localtime(&timer);
  strftime(str_data,0x40,"%Y-%m-%d[%H:%M:%S][GYRO]",__tp);
  strcat(GyroLogFileName,str_data);
  sVar1 = strlen(GyroLogFileName);
  builtin_strncpy(GyroLogFileName + sVar1,".txt",4);
  GyroLogFileName[sVar1 + 4] = '\0';
  fd_gyro_log = (FILE *)fopen(GyroLogFileName,"w");
  if ((FILE *)fd_gyro_log == (FILE *)0x0) {
    puts("Failed to create gyro log file.");
  }
  return;
}

Assistant:

void CreateGyroLogFile(void)
{
	char str_data[64];
	char str_cwd[64];
	time_t timer = time(NULL);

	strftime(str_data, sizeof(str_data), "%Y-%m-%d[%H:%M:%S][GYRO]", localtime(&timer));
	strcat(GyroLogFileName, str_data);
	strcat(GyroLogFileName, ".txt");
	fd_gyro_log = fopen(GyroLogFileName, "w");

	if (fd_gyro_log == NULL)
	{
		printf("Failed to create gyro log file.\n");
	}
}